

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowers.cpp
# Opt level: O2

void __thiscall flowers::Rose::Rose(Rose *this,string *name)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  this->thorn = true;
  return;
}

Assistant:

Rose::Rose(std::string name)
        : name(name), thorn(true)
    {}